

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int write_path_table(archive_write *a,int type_m,vdd *vdd)

{
  long in_RDX;
  size_t in_RDI;
  size_t path_table_size;
  int r;
  int depth;
  ulong local_30;
  int local_28;
  int local_24;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  local_28 = 0;
  local_30 = 0;
  local_24 = 0;
  while( true ) {
    if (*(int *)(in_RDX + 0x18) <= local_24) {
      if ((local_30 & 0xfff) != 0) {
        local_28 = write_null((archive_write *)
                              CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI);
      }
      return local_28;
    }
    local_28 = _write_path_table((archive_write *)vdd,depth,r,(vdd *)path_table_size);
    if (local_28 < 0) break;
    local_30 = (long)local_28 + local_30;
    local_24 = local_24 + 1;
  }
  return local_28;
}

Assistant:

static int
write_path_table(struct archive_write *a, int type_m, struct vdd *vdd)
{
	int depth, r;
	size_t path_table_size;

	r = ARCHIVE_OK;
	path_table_size = 0;
	for (depth = 0; depth < vdd->max_depth; depth++) {
		r = _write_path_table(a, type_m, depth, vdd);
		if (r < 0)
			return (r);
		path_table_size += r;
	}

	/* Write padding data. */
	path_table_size = path_table_size % PATH_TABLE_BLOCK_SIZE;
	if (path_table_size > 0)
		r = write_null(a, PATH_TABLE_BLOCK_SIZE - path_table_size);
	return (r);
}